

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::FloatingEqMatcher<double>::Impl<double>::DescribeTo
          (Impl<double> *this,ostream *os)

{
  undefined8 uVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0x11;
  if (((ulong)this->expected_ & 0xfffffffffffff) == 0 ||
      (~(ulong)this->expected_ & 0x7ff0000000000000) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"is approximately ",0x11);
    std::ostream::_M_insert<double>(this->expected_);
    if (this->max_abs_error_ < 0.0) goto LAB_00136059;
    std::__ostream_insert<char,std::char_traits<char>>(os," (absolute error <= ",0x14);
    poVar2 = std::ostream::_M_insert<double>(this->max_abs_error_);
    pcVar4 = ")";
    lVar3 = 1;
  }
  else {
    poVar2 = os;
    if (this->nan_eq_nan_ == true) {
      pcVar4 = "is NaN";
      lVar3 = 6;
    }
    else {
      pcVar4 = "never matches";
      lVar3 = 0xd;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
LAB_00136059:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar1;
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
      // os->precision() returns the previously set precision, which we
      // store to restore the ostream to its original configuration
      // after outputting.
      const ::std::streamsize old_precision = os->precision(
          ::std::numeric_limits<FloatType>::digits10 + 2);
      if (FloatingPoint<FloatType>(expected_).is_nan()) {
        if (nan_eq_nan_) {
          *os << "is NaN";
        } else {
          *os << "never matches";
        }
      } else {
        *os << "is approximately " << expected_;
        if (HasMaxAbsError()) {
          *os << " (absolute error <= " << max_abs_error_ << ")";
        }
      }
      os->precision(old_precision);
    }